

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_chol_t * matd_chol(matd_t *A)

{
  int iVar1;
  matd_t mVar2;
  uint uVar3;
  int iVar4;
  matd_t *pmVar5;
  matd_chol_t *pmVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  matd_t mVar18;
  
  uVar3 = A->nrows;
  if (uVar3 != A->ncols) {
    __assert_fail("A->nrows == A->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x72d,"matd_chol_t *matd_chol(matd_t *)");
  }
  pmVar5 = matd_copy(A);
  uVar7 = 0;
  if (0 < (int)uVar3) {
    uVar7 = uVar3;
  }
  iVar15 = 1;
  iVar4 = 1;
  uVar8 = uVar3;
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    uVar11 = pmVar5->ncols;
    iVar1 = uVar11 + 1;
    uVar12 = (ulong)(iVar1 * uVar9);
    mVar2 = pmVar5[uVar12 + 1];
    mVar18.nrows = 0xe2308c3a;
    mVar18.ncols = 0x3e45798e;
    if (1e-08 <= (double)mVar2) {
      mVar18 = mVar2;
    }
    uVar13 = uVar8;
    while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
      pmVar5[uVar12 + 1] = (matd_t)((double)pmVar5[uVar12 + 1] * (1.0 / SQRT((double)mVar18)));
      uVar12 = (ulong)((int)uVar12 + 1);
    }
    if ((double)mVar2 <= 0.0) {
      iVar15 = 0;
    }
    iVar10 = uVar11 * uVar9;
    uVar11 = iVar4 * iVar1;
    for (iVar14 = iVar4; iVar14 < (int)uVar3; iVar14 = iVar14 + 1) {
      mVar2 = pmVar5[(ulong)(uint)(iVar10 + iVar14) + 1];
      uVar13 = uVar11;
      iVar16 = iVar14;
      if (((double)mVar2 != 0.0) || (NAN((double)mVar2))) {
        for (; iVar16 < (int)uVar3; iVar16 = iVar16 + 1) {
          pmVar5[(ulong)uVar13 + 1] =
               (matd_t)((double)pmVar5[(ulong)uVar13 + 1] -
                       (double)pmVar5[(ulong)(uint)(iVar10 + iVar16) + 1] * (double)mVar2);
          uVar13 = uVar13 + 1;
        }
      }
      uVar11 = uVar11 + iVar1;
    }
    iVar4 = iVar4 + 1;
    uVar8 = uVar8 - 1;
  }
  pmVar6 = (matd_chol_t *)calloc(1,0x10);
  pmVar6->is_spd = iVar15;
  pmVar6->u = pmVar5;
  return pmVar6;
}

Assistant:

matd_chol_t *matd_chol(matd_t *A)
{
    assert(A->nrows == A->ncols);
    int N = A->nrows;

    // make upper right
    matd_t *U = matd_copy(A);

    // don't actually need to clear lower-left... we won't touch it.
/*    for (int i = 0; i < U->nrows; i++) {
      for (int j = 0; j < i; j++) {
//            assert(MATD_EL(U, i, j) == MATD_EL(U, j, i));
MATD_EL(U, i, j) = 0;
}
}
*/
    int is_spd = 1; // (A->nrows == A->ncols);

    for (int i = 0; i < N; i++) {
        double d = MATD_EL(U, i, i);
        is_spd &= (d > 0);

        if (d < MATD_EPS)
            d = MATD_EPS;
        d = 1.0 / sqrt(d);

        for (int j = i; j < N; j++)
            MATD_EL(U, i, j) *= d;

        for (int j = i+1; j < N; j++) {
            double s = MATD_EL(U, i, j);

            if (s == 0)
                continue;

            for (int k = j; k < N; k++) {
                MATD_EL(U, j, k) -= MATD_EL(U, i, k)*s;
            }
        }
    }

    matd_chol_t *chol = calloc(1, sizeof(matd_chol_t));
    chol->is_spd = is_spd;
    chol->u = U;
    return chol;
}